

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_HasRequiredOps(MRIStepInnerStepper stepper)

{
  MRIStepInnerStepper stepper_local;
  int local_4;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    local_4 = -0x16;
  }
  else if (stepper->ops == (MRIStepInnerStepper_Ops)0x0) {
    local_4 = -0x16;
  }
  else if ((stepper->ops->evolve == (MRIStepInnerEvolveFn)0x0) ||
          (stepper->ops->fullrhs == (MRIStepInnerFullRhsFn)0x0)) {
    local_4 = -0x16;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStepInnerStepper_HasRequiredOps(MRIStepInnerStepper stepper)
{
  if (stepper == NULL) return ARK_ILL_INPUT;
  if (stepper->ops == NULL) return ARK_ILL_INPUT;

  if (stepper->ops->evolve && stepper->ops->fullrhs)
    return ARK_SUCCESS;
  else
    return ARK_ILL_INPUT;
}